

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall sentencepiece::SelfTestData_Sample::~SelfTestData_Sample(SelfTestData_Sample *this)

{
  ~SelfTestData_Sample(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

SelfTestData_Sample::~SelfTestData_Sample() {
  // @@protoc_insertion_point(destructor:sentencepiece.SelfTestData.Sample)
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}